

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

void Fra_BmcStop(Fra_Bmc_t *p)

{
  Fra_Bmc_t *p_local;
  
  Aig_ManStop(p->pAigFrames);
  if (p->pAigFraig != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pAigFraig);
  }
  if (p->pObjToFrames != (Aig_Obj_t **)0x0) {
    free(p->pObjToFrames);
    p->pObjToFrames = (Aig_Obj_t **)0x0;
  }
  if (p->pObjToFraig != (Aig_Obj_t **)0x0) {
    free(p->pObjToFraig);
    p->pObjToFraig = (Aig_Obj_t **)0x0;
  }
  if (p != (Fra_Bmc_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Fra_BmcStop( Fra_Bmc_t * p )
{
    Aig_ManStop( p->pAigFrames );
    if ( p->pAigFraig )
        Aig_ManStop( p->pAigFraig );
    ABC_FREE( p->pObjToFrames );
    ABC_FREE( p->pObjToFraig );
    ABC_FREE( p );
}